

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

bool __thiscall XmlRpc::XmlRpcValue::binaryFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  Decoder *this_00;
  size_t __n;
  char *plaintext_out;
  int iVar1;
  int *in_RDX;
  ulong in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  bool bVar2;
  size_t size;
  Decoder decoder;
  size_t encoded_size;
  size_t valueEnd;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  allocator_type *__a;
  allocator_type local_3e;
  undefined1 local_3d;
  size_t local_30;
  long local_28;
  int *local_20;
  ulong local_18;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::__cxx11::string::find((char)in_RSI,0x3c);
  bVar2 = local_28 != -1;
  if (bVar2) {
    local_30 = local_28 - *local_20;
    *(undefined4 *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl = 6;
    this_00 = (Decoder *)operator_new(0x18);
    __n = anon_unknown_3::base64DecodedSize(local_30);
    local_3d = 0;
    __a = &local_3e;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector(in_RDI,__n,(value_type *)this_00,__a);
    *(Decoder **)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8 =
         this_00;
    std::allocator<char>::~allocator(&local_3e);
    base64::Decoder::Decoder
              ((Decoder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
    plaintext_out = (char *)std::__cxx11::string::operator[](local_18);
    iVar1 = (int)local_30;
    std::vector<char,_std::allocator<char>_>::operator[]
              (*(vector<char,_std::allocator<char>_> **)
                &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8,0);
    base64::Decoder::decode(this_00,(char *)__a,iVar1,plaintext_out);
    std::vector<char,_std::allocator<char>_>::resize(in_RDI,__n);
    *local_20 = *local_20 + (int)local_30;
  }
  return bVar2;
}

Assistant:

bool XmlRpcValue::binaryFromXml(std::string const& valueXml, int* offset)
  {
    size_t valueEnd = valueXml.find('<', *offset);
    if (valueEnd == std::string::npos)
      return false;     // No end tag;

    std::size_t encoded_size = valueEnd - *offset;


    _type = TypeBase64;
    // might reserve too much, we'll shrink later
    _value.asBinary = new BinaryData(base64DecodedSize(encoded_size), '\0');

    base64::Decoder decoder;
    std::size_t size = decoder.decode(&valueXml[*offset], encoded_size, &(*_value.asBinary)[0]);
    _value.asBinary->resize(size);

    *offset += encoded_size;
    return true;
  }